

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk.cpp
# Opt level: O0

bool __thiscall
phyr::Disk::intersectRay(Disk *this,Ray *r,double *t0,SurfaceInteraction *si,bool testAlpha)

{
  void *in_RCX;
  double *in_RDX;
  double in_RDI;
  byte in_R8B;
  Vector3f pError;
  Normal3f dndv;
  Normal3f dndu;
  Vector3f dpdv;
  Vector3f dpdu;
  double v;
  double oneMinusV;
  double rHit;
  double u;
  double phi;
  double dist2;
  Point3f pHit;
  double tShapeHit;
  Ray ray;
  Vector3f dErr;
  Vector3f oErr;
  double in_stack_fffffffffffffa98;
  Vector3<double> *in_stack_fffffffffffffaa0;
  double in_stack_fffffffffffffaa8;
  Vector3<double> *in_stack_fffffffffffffab0;
  Ray *in_stack_fffffffffffffad0;
  Vector3f *in_stack_fffffffffffffb18;
  Point2f *in_stack_fffffffffffffb20;
  Vector3f *in_stack_fffffffffffffb28;
  Vector3f *in_stack_fffffffffffffb30;
  Ray *in_stack_fffffffffffffb38;
  SurfaceInteraction *in_stack_fffffffffffffb40;
  Vector3f *in_stack_fffffffffffffb50;
  Normal3f *in_stack_fffffffffffffb58;
  Normal3f *in_stack_fffffffffffffb60;
  Shape *in_stack_fffffffffffffb68;
  SurfaceInteraction *in_stack_fffffffffffffc78;
  Transform *in_stack_fffffffffffffc80;
  undefined1 local_350 [440];
  Vector3<double> local_198;
  Normal3<double> local_180;
  Normal3<double> local_168;
  Vector3<double> local_150 [3];
  Vector3<double> local_108;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  undefined8 local_b0;
  double local_a8;
  double local_90;
  double local_78;
  double local_70;
  Vector3<double> local_68;
  Vector3<double> local_50;
  byte local_31;
  void *local_30;
  double *local_28;
  bool local_9;
  
  local_31 = in_R8B & 1;
  local_30 = in_RCX;
  local_28 = in_RDX;
  Vector3<double>::Vector3(&local_50);
  Vector3<double>::Vector3(&local_68);
  Transform::operator()
            ((Transform *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
             in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  if ((local_78 != 0.0) || (NAN(local_78))) {
    local_a8 = (*(double *)((long)in_RDI + 0x20) - local_90) / local_78;
    if ((local_a8 <= 0.0) || (local_70 <= local_a8)) {
      local_9 = false;
    }
    else {
      Ray::operator()(in_stack_fffffffffffffad0,in_RDI);
      local_c8 = local_c0 * local_c0 + local_b8 * local_b8;
      if ((*(double *)((long)in_RDI + 0x28) * *(double *)((long)in_RDI + 0x28) < local_c8) ||
         (local_c8 < *(double *)((long)in_RDI + 0x30) * *(double *)((long)in_RDI + 0x30))) {
        local_9 = false;
      }
      else {
        local_d0 = atan2(local_b8,local_c0);
        if (local_d0 < 0.0) {
          local_d0 = local_d0 + 6.283185307179586;
        }
        if (local_d0 < *(double *)((long)in_RDI + 0x38) ||
            local_d0 == *(double *)((long)in_RDI + 0x38)) {
          local_d8 = local_d0 / *(double *)((long)in_RDI + 0x38);
          local_e0 = sqrt(local_c8);
          local_e8 = (local_e0 - *(double *)((long)in_RDI + 0x30)) /
                     (*(double *)((long)in_RDI + 0x28) - *(double *)((long)in_RDI + 0x30));
          local_f0 = 1.0 - local_e8;
          Vector3<double>::Vector3
                    (&local_108,-*(double *)((long)in_RDI + 0x38) * local_b8,
                     *(double *)((long)in_RDI + 0x38) * local_c0,0.0);
          Vector3<double>::Vector3(local_150,local_c0,local_b8,0.0);
          Vector3<double>::operator*(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
          Vector3<double>::operator/(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
          Normal3<double>::Normal3(&local_168,0.0,0.0,0.0);
          Normal3<double>::Normal3(&local_180,0.0,0.0,0.0);
          local_b0 = *(undefined8 *)((long)in_RDI + 0x20);
          Vector3<double>::Vector3(&local_198,0.0,0.0,0.0);
          Vector3<double>::operator-(in_stack_fffffffffffffaa0);
          Point2<double>::Point2((Point2<double> *)&stack0xfffffffffffffad0,local_d8,local_f0);
          SurfaceInteraction::SurfaceInteraction
                    (in_stack_fffffffffffffb40,&in_stack_fffffffffffffb38->o,
                     in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                     in_stack_fffffffffffffb18,in_stack_fffffffffffffb50,in_stack_fffffffffffffb58,
                     in_stack_fffffffffffffb60,in_stack_fffffffffffffb68);
          Transform::operator()(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
          memcpy(local_30,local_350,0x1b8);
          *local_28 = local_a8;
          local_9 = true;
        }
        else {
          local_9 = false;
        }
      }
    }
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool Disk::intersectRay(const Ray& r, Real* t0, SurfaceInteraction* si,
                        bool testAlpha) const {
    // Transform {Ray} to local space
    Vector3f oErr, dErr;
    Ray ray = (*worldToLocal)(r, &oErr, &dErr);

    // Compute plane intersection for disk

    // Reject disk intersections for rays parallel to the disk's plane
    if (ray.d.z == 0) return false;
    Real tShapeHit = (height - ray.o.z) / ray.d.z;
    if (tShapeHit <= 0 || tShapeHit >= ray.tMax) return false;

    // See if hit point is inside disk radii and {phiMax}
    Point3f pHit = ray(tShapeHit);
    Real dist2 = pHit.x * pHit.x + pHit.y * pHit.y;
    if (dist2 > radius * radius || dist2 < innerRadius * innerRadius)
        return false;

    // Test disk {phi} value against {phiMax}
    Real phi = std::atan2(pHit.y, pHit.x);
    if (phi < 0) phi += 2 * Pi;
    if (phi > phiMax) return false;

    // Find parametric representation of disk hit
    Real u = phi / phiMax;
    Real rHit = std::sqrt(dist2);
    Real oneMinusV = ((rHit - innerRadius) / (radius - innerRadius));
    Real v = 1 - oneMinusV;
    Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
    Vector3f dpdv = Vector3f(pHit.x, pHit.y, 0.) * (innerRadius - radius) / rHit;
    Normal3f dndu(0, 0, 0), dndv(0, 0, 0);

    // Refine disk intersection point
    pHit.z = height;

    // Compute error bounds for disk intersection
    Vector3f pError(0, 0, 0);

    // Initialize _SurfaceInteraction_ from parametric information
    *si = (*localToWorld)(SurfaceInteraction(pHit, -ray.d, pError, Point2f(u, v),
                                             dpdu, dpdv, dndu, dndv, this));

    // Update _tHit_ for quadric intersection
    *t0 = Real(tShapeHit);
    return true;
}